

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# actor.h
# Opt level: O1

void __thiscall AActor::RestoreDamage(AActor *this)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  
  if ((this->super_DThinker).super_DObject.Class == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar2);
  }
  pPVar1 = (this->super_DThinker).super_DObject.Class;
  this->DamageVal = *(int *)(pPVar1->Defaults + 0x1a8);
  if (pPVar1 == (PClass *)0x0) {
    iVar2 = (**(this->super_DThinker).super_DObject._vptr_DObject)(this);
    (this->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var_00,iVar2);
  }
  this->DamageFunc =
       *(VMFunction **)(((this->super_DThinker).super_DObject.Class)->Defaults + 0x1b0);
  return;
}

Assistant:

void RestoreDamage()
	{
		DamageVal = GetDefault()->DamageVal;
		DamageFunc = GetDefault()->DamageFunc;
	}